

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestDerivativesPreproc.cc
# Opt level: O3

int main(void)

{
  double dVar1;
  double dVar2;
  void *pvVar3;
  ostream *poVar4;
  pointer piVar5;
  undefined8 uVar6;
  long lVar7;
  int jp;
  ulong uVar8;
  size_type __n;
  long lVar9;
  uint uVar10;
  long lVar11;
  double *e;
  double *pdVar12;
  ulong uVar13;
  ulong uVar14;
  initializer_list<int> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  bool local_9e9;
  vector<double,_std::allocator<double>_> vp;
  uint local_9bc;
  vector<double,_std::allocator<double>_> vm;
  vector<double,_std::allocator<double>_> ders;
  _Any_data local_978;
  code *local_968;
  undefined8 uStack_960;
  vector<double,_std::allocator<double>_> parsprep;
  vector<double,_std::allocator<double>_> x;
  vector<int,_std::allocator<int>_> arch;
  vector<double,_std::allocator<double>_> pars;
  Preprocessing Preproc;
  vector<double,_std::allocator<double>_> local_8d8;
  vector<double,_std::allocator<double>_> nnl;
  vector<double,_std::allocator<double>_> parsp;
  vector<double,_std::allocator<double>_> prepf;
  vector<double,_std::allocator<double>_> parsm;
  vector<double,_std::allocator<double>_> anders;
  FeedForwardNN<double> nnm;
  FeedForwardNN<double> nnp;
  FeedForwardNN<double> nn;
  
  nn._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x500000001;
  nn._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x200000005;
  __l._M_len = 4;
  __l._M_array = (iterator)&nn;
  std::vector<int,_std::allocator<int>_>::vector(&arch,__l,(allocator_type *)&nnp);
  Preproc.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  Preproc.super__Function_base._M_functor._8_8_ = 0;
  Preproc._M_invoker =
       std::
       _Function_handler<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/rabah-khalek[P]NNAD/tests/TestDerivativesPreproc.cc:16:56)>
       ::_M_invoke;
  Preproc.super__Function_base._M_manager =
       std::
       _Function_handler<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/rabah-khalek[P]NNAD/tests/TestDerivativesPreproc.cc:16:56)>
       ::_M_manager;
  nn._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x4000000000000000;
  nn._ActFun.super__Function_base._M_functor._M_unused._M_object = (void *)0x4008000000000000;
  nn._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0xbff0000000000000;
  nn._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x3ff0000000000000;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&nn;
  std::vector<double,_std::allocator<double>_>::vector(&parsprep,__l_00,(allocator_type *)&nnp);
  vm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)vm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_ << 0x20);
  local_978._0_4_ = 1;
  x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start.
  _0_1_ = 1;
  nnp._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  nnp._ActFun.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  nnp._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  nnp._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  vp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  vp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  anders.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  anders.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)nnad::Sigmoid<double>;
  anders.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::_Function_handler<double_(const_double_&),_double_(*)(const_double_&)>::
                _M_manager;
  nnm._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  nnm._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)nnad::dSigmoid<double>;
  nnm._ActFun.super__Function_base._M_functor._M_unused._M_object =
       std::_Function_handler<double_(const_double_&),_double_(*)(const_double_&)>::_M_invoke;
  nnm._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::_Function_handler<double_(const_double_&),_double_(*)(const_double_&)>::
                _M_manager;
  nnad::FeedForwardNN<double>::FeedForwardNN
            (&nn,&arch,(int *)&vm,(bool *)&x,(function<double_(const_double_&)> *)&anders,
             (function<double_(const_double_&)> *)&nnm,(OutputFunction *)local_978._M_pod_data,
             (Preprocessing *)&nnp,&vp);
  if (nnm._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (pointer)0x0) {
    (*(code *)nnm._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage)(&nnm,&nnm,3);
  }
  if (anders.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (pointer)0x0) {
    (*(code *)anders.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage)(&anders,&anders,3);
  }
  if (vp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(vp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)vp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)vp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (nnp._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (pointer)0x0) {
    (*(code *)nnp._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage)(&nnp,&nnp,3);
  }
  vp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)vp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start & 0xffffffff00000000);
  vm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(vm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,2);
  local_978._M_pod_data[0] = 1;
  anders.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  anders.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)nnad::Sigmoid<double>;
  anders.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::_Function_handler<double_(const_double_&),_double_(*)(const_double_&)>::
                _M_manager;
  nnm._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  nnm._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)nnad::dSigmoid<double>;
  nnm._ActFun.super__Function_base._M_functor._M_unused._M_object =
       std::_Function_handler<double_(const_double_&),_double_(*)(const_double_&)>::_M_invoke;
  nnm._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::_Function_handler<double_(const_double_&),_double_(*)(const_double_&)>::
                _M_manager;
  nnad::FeedForwardNN<double>::FeedForwardNN
            (&nnp,&arch,(int *)&vp,(bool *)local_978._M_pod_data,
             (function<double_(const_double_&)> *)&anders,(function<double_(const_double_&)> *)&nnm,
             (OutputFunction *)&vm,&Preproc,&parsprep);
  if (nnm._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (pointer)0x0) {
    (*(code *)nnm._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage)(&nnm,&nnm,3);
  }
  if (anders.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (pointer)0x0) {
    (*(code *)anders.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage)(&anders,&anders,3);
  }
  anders.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3f50624dd2f1a9fc;
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&anders;
  std::vector<double,_std::allocator<double>_>::vector(&x,__l_01,(allocator_type *)&nnm);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Input: x = { ",0xd);
  for (pdVar12 = (double *)
                 CONCAT71(x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start._1_7_,
                          x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start._0_1_);
      pdVar12 !=
      x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish; pdVar12 = pdVar12 + 1) {
    poVar4 = std::ostream::_M_insert<double>(*pdVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"}\n",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
  std::ostream::put(-0x10);
  std::ostream::flush();
  nnad::FeedForwardNN<double>::Evaluate(&nnl,&nn,&x);
  if (Preproc.super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_00103288:
    uVar6 = std::__throw_bad_function_call();
    __clang_call_terminate(uVar6);
  }
  (*Preproc._M_invoker)(&prepf,(_Any_data *)&Preproc,&x,&parsprep);
  nnad::FeedForwardNN<double>::GetParameters(&pars,&nn);
  ders.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  ders.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  ders.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar13 = (long)pars.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)pars.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if (0 < arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish[-1]) {
    lVar11 = 0;
    piVar5 = arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    do {
      anders.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)(nnl.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar11] *
                           nnl.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar11] *
                          prepf.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar11]);
      if (ders.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          ders.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&ders,(iterator)
                         ders.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,(double *)&anders);
        piVar5 = arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish;
      }
      else {
        *ders.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_finish = (double)anders.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
        ders.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish = ders.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < piVar5[-1]);
  }
  uVar10 = (uint)(uVar13 >> 3);
  if (0 < (int)uVar10) {
    uVar14 = (ulong)(uVar10 & 0x7fffffff);
    uVar13 = 0;
    do {
      std::vector<double,_std::allocator<double>_>::vector
                (&parsp,(long)pars.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)pars.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start >> 3,(allocator_type *)&anders);
      std::vector<double,_std::allocator<double>_>::vector
                (&parsm,(long)pars.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)pars.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start >> 3,(allocator_type *)&anders);
      uVar8 = 0;
      do {
        if (uVar13 == uVar8) {
          parsp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar13] =
               pars.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar13] * 1.00001;
          dVar1 = pars.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar13] * 0.99999;
        }
        else {
          dVar1 = pars.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar8];
          parsp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar8] = dVar1;
        }
        parsm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar8] = dVar1;
        uVar8 = uVar8 + 1;
      } while (uVar14 != uVar8);
      nnm._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      nnm._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)nnad::Sigmoid<double>;
      nnm._ActFun.super__Function_base._M_functor._M_unused._M_object =
           std::_Function_handler<double_(const_double_&),_double_(*)(const_double_&)>::_M_invoke;
      nnm._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)std::_Function_handler<double_(const_double_&),_double_(*)(const_double_&)>::
                    _M_manager;
      vp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      vp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)nnad::dSigmoid<double>;
      vp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)std::_Function_handler<double_(const_double_&),_double_(*)(const_double_&)>::
                    _M_manager;
      local_8d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT44(local_8d8.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,1);
      local_9bc = local_9bc & 0xffffff00;
      vm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      vm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      vm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_968 = (code *)0x0;
      local_978._M_unused._M_object = (void *)0x0;
      local_978._8_8_ = 0;
      nnad::FeedForwardNN<double>::FeedForwardNN
                ((FeedForwardNN<double> *)&anders,&arch,&parsp,
                 (function<double_(const_double_&)> *)&nnm,(function<double_(const_double_&)> *)&vp,
                 (OutputFunction *)&local_8d8,(bool *)&local_9bc,(Preprocessing *)&vm,
                 (vector<double,_std::allocator<double>_> *)&local_978);
      if (local_978._M_unused._M_object != (void *)0x0) {
        operator_delete(local_978._M_unused._M_object,(long)local_968 - local_978._0_8_);
      }
      if (vm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage != (pointer)0x0) {
        (*(code *)vm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage)(&vm,&vm,3);
      }
      if (vp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage != (pointer)0x0) {
        (*(code *)vp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage)
                  ((function<double_(const_double_&)> *)&vp,(function<double_(const_double_&)> *)&vp
                   ,3);
      }
      if (nnm._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage != (pointer)0x0) {
        (*(code *)nnm._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage)(&nnm,&nnm,3);
      }
      vp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      vp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)nnad::Sigmoid<double>;
      vp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)std::_Function_handler<double_(const_double_&),_double_(*)(const_double_&)>::
                    _M_manager;
      vm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      vm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)nnad::dSigmoid<double>;
      vm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)std::_Function_handler<double_(const_double_&),_double_(*)(const_double_&)>::
                    _M_manager;
      local_9bc = 1;
      local_9e9 = false;
      local_968 = (code *)0x0;
      uStack_960 = 0;
      local_978._M_unused._M_object = (void *)0x0;
      local_978._8_8_ = 0;
      local_8d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_8d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_8d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      nnad::FeedForwardNN<double>::FeedForwardNN
                (&nnm,&arch,&parsm,(function<double_(const_double_&)> *)&vp,
                 (function<double_(const_double_&)> *)&vm,&local_9bc,&local_9e9,
                 (Preprocessing *)&local_978,&local_8d8);
      if (local_8d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_8d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_8d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_8d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_968 != (code *)0x0) {
        (*local_968)(&local_978,&local_978,3);
      }
      if (vm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage != (pointer)0x0) {
        (*(code *)vm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage)(&vm,&vm,3);
      }
      if (vp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage != (pointer)0x0) {
        (*(code *)vp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage)
                  ((function<double_(const_double_&)> *)&vp,(function<double_(const_double_&)> *)&vp
                   ,3);
      }
      nnad::FeedForwardNN<double>::Evaluate(&vp,(FeedForwardNN<double> *)&anders,&x);
      nnad::FeedForwardNN<double>::Evaluate(&vm,&nnm,&x);
      if (0 < arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish[-1]) {
        lVar11 = 0;
        piVar5 = arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish;
        do {
          local_978._M_unused._0_8_ =
               (undefined8)
               (((((vp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar11] -
                   vm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar11]) *
                   (nnl.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar11] +
                   nnl.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar11]) * 0.5) / 1e-05) /
                pars.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar13]) *
               prepf.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar11]);
          if (ders.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              ders.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (&ders,(iterator)
                             ders.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish,(double *)&local_978);
            piVar5 = arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          }
          else {
            *ders.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish = (double)local_978._M_unused._0_8_;
            ders.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
            ._M_finish = ders.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < piVar5[-1]);
      }
      if (vm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(vm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)vm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)vm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (vp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(vp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)vp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)vp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      nnad::FeedForwardNN<double>::~FeedForwardNN(&nnm);
      nnad::FeedForwardNN<double>::~FeedForwardNN((FeedForwardNN<double> *)&anders);
      if (parsm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(parsm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)parsm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)parsm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (parsp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(parsp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)parsp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)parsp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar14);
  }
  __n = (long)parsprep.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)parsprep.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start >> 3;
  if (0 < (int)__n) {
    lVar11 = 0;
    do {
      std::vector<double,_std::allocator<double>_>::vector(&anders,__n,(allocator_type *)&nnm);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&nnm,
                 (long)parsprep.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)parsprep.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3,(allocator_type *)&vp);
      if ((long)parsprep.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)parsprep.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        lVar7 = (long)parsprep.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)parsprep.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3;
        lVar9 = 0;
        do {
          if (lVar11 == lVar9) {
            anders.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar11] =
                 parsprep.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar11] * 1.00001;
            dVar1 = parsprep.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar11] * 0.99999;
          }
          else {
            dVar1 = parsprep.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar9];
            anders.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar9] = dVar1;
          }
          *(double *)
           (nnm._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start + lVar9 * 2) = dVar1;
          lVar9 = lVar9 + 1;
        } while (lVar7 + (ulong)(lVar7 == 0) != lVar9);
      }
      if (Preproc.super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
LAB_00103283:
        std::__throw_bad_function_call();
        goto LAB_00103288;
      }
      (*Preproc._M_invoker)(&vp,(_Any_data *)&Preproc,&x,&anders);
      if (Preproc.super__Function_base._M_manager == (_Manager_type)0x0) goto LAB_00103283;
      (*Preproc._M_invoker)
                (&vm,(_Any_data *)&Preproc,&x,(vector<double,_std::allocator<double>_> *)&nnm);
      if (0 < arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish[-1]) {
        lVar7 = 0;
        piVar5 = arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish;
        do {
          local_978._M_unused._0_8_ =
               (undefined8)
               ((((vp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar7] -
                  vm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar7]) *
                  nnl.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar7] *
                  nnl.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar7] * 0.5) / 1e-05) /
               parsprep.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar11]);
          if (ders.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              ders.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (&ders,(iterator)
                             ders.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish,(double *)&local_978);
            piVar5 = arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          }
          else {
            *ders.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish = (double)local_978._M_unused._0_8_;
            ders.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
            ._M_finish = ders.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < piVar5[-1]);
      }
      if (vm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(vm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)vm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)vm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (vp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(vp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)vp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)vp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (nnm._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(nnm._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)nnm._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)nnm._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (anders.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(anders.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)anders.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)anders.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      lVar11 = lVar11 + 1;
      __n = (long)parsprep.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)parsprep.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    } while (lVar11 < (int)((ulong)((long)parsprep.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                   (long)parsprep.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start) >> 3));
  }
  nnad::FeedForwardNN<double>::Derive(&anders,&nnp,&x);
  uVar13 = (long)anders.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)anders.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
  *(uint *)(std::__throw_out_of_range_fmt + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__throw_out_of_range_fmt + *(long *)(std::cout + -0x18)) & 0xfffffefb | 0x100;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"id\t num. ders.\t an. ders.\t   ratio",0x22);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
  std::ostream::put(-0x10);
  std::ostream::flush();
  uVar10 = (uint)(uVar13 >> 3);
  if (0 < (int)uVar10) {
    uVar13 = 0;
    do {
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
      poVar4 = std::ostream::_M_insert<double>
                         (ders.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar13]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
      poVar4 = std::ostream::_M_insert<double>
                         (anders.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar13]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
      dVar1 = anders.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar13];
      dVar2 = 0.0;
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        dVar2 = ders.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar13] / dVar1;
      }
      poVar4 = std::ostream::_M_insert<double>(dVar2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      uVar13 = uVar13 + 1;
    } while ((uVar10 & 0x7fffffff) != uVar13);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  if (anders.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(anders.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)anders.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)anders.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (ders.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(ders.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)ders.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)ders.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (pars.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(pars.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)pars.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)pars.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (prepf.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(prepf.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)prepf.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)prepf.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (nnl.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(nnl.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)nnl.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)nnl.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pvVar3 = (void *)CONCAT71(x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_,
                            x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar3);
  }
  nnad::FeedForwardNN<double>::~FeedForwardNN(&nnp);
  nnad::FeedForwardNN<double>::~FeedForwardNN(&nn);
  if (parsprep.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(parsprep.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)parsprep.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)parsprep.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (Preproc.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*Preproc.super__Function_base._M_manager)
              ((_Any_data *)&Preproc,(_Any_data *)&Preproc,__destroy_functor);
  }
  if (arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main()
{
  // Define architecture
  const std::vector<int> arch{1, 5, 5, 2};

  // Define preprocessing function
  nnad::FeedForwardNN<double>::Preprocessing Preproc = [] (std::vector<double> const& in, std::vector<double> const& par) -> std::vector<double>
  {
    const double x = in[0];
    const double f1 = pow(x, par[0]) * pow(1 - x, par[1]);
    const double f2 = pow(x, par[2]) * pow(1 - x, par[3]);
    return {f1, f2, log(x) * f1, 0, log(1 - x) * f1, 0, 0, log(x) * f2, 0, log(1 - x) * f2};
  };

  // Preprocessing parameters
  const std::vector<double> parsprep{-1, 1, 2, 3};

  // Initialise NN needed for the numerical derivative
  const nnad::FeedForwardNN<double> nn{arch, 0, nnad::OutputFunction::LINEAR, true};

  // Initialise NN with preprocessing
  const nnad::FeedForwardNN<double> nnp{arch, 0, nnad::OutputFunction::QUADRATIC, true, Preproc, parsprep};

  // Input vector
  std::vector<double> x{0.001};
  std::cout << "Input: x = { ";
  for (auto const& e : x)
    std::cout << e << " ";
  std::cout << "}\n" << std::endl;

  // Get NNs at x
  const std::vector<double> nnl = nn.Evaluate(x);

  // Get preprocessing at x
  const std::vector<double> prepf = Preproc(x, parsprep);

  // Compute the derivatives numerically as incremental ratios
  const double eps = 1e-5;
  const std::vector<double> pars = nn.GetParameters();
  const int np = (int) pars.size();

  // Square and include preprocessing function
  std::vector<double> ders;
  for (int io = 0; io < arch.back(); io++)
    ders.push_back(pow(nnl[io], 2) * prepf[io]);

  // Loop over all derivatives w.r.t the NN parameters
  for (int ip = 0; ip < np; ip++)
    {
      // Displace ip-th parameter by "eps" up and down
      std::vector<double> parsp(pars.size());
      std::vector<double> parsm(pars.size());
      for (int jp = 0; jp < np; jp++)
        {
          parsp[jp] = (jp == ip ? pars[jp] * ( 1 + eps ) : pars[jp]);
          parsm[jp] = (jp == ip ? pars[jp] * ( 1 - eps ) : pars[jp]);
        }

      // Define NNs with the displaced parameters.
      const nnad::FeedForwardNN<double> nnp{arch, parsp};
      const nnad::FeedForwardNN<double> nnm{arch, parsm};

      // Get outputs and compute the derivative numerically
      const std::vector<double> vp = nnp.Evaluate(x);
      const std::vector<double> vm = nnm.Evaluate(x);

      for (int io = 0; io < arch.back(); io++)
        ders.push_back(2 * nnl[io] * ( vp[io] - vm[io] ) / 2 / eps / pars[ip] * prepf[io]);
    }

  // Now include derivatives w.r.t. the preprocessing parameters
  for (int ip = 0; ip < (int) parsprep.size(); ip++)
    {
      // Displace ip-th parameter by "eps" up and down
      std::vector<double> parsp(parsprep.size());
      std::vector<double> parsm(parsprep.size());
      for (int jp = 0; jp < parsprep.size(); jp++)
        {
          parsp[jp] = (jp == ip ? parsprep[jp] * ( 1 + eps ) : parsprep[jp]);
          parsm[jp] = (jp == ip ? parsprep[jp] * ( 1 - eps ) : parsprep[jp]);
        }

      // Define preprocessing function with the displaced parameters.
      const std::vector<double> vp = Preproc(x, parsp);
      const std::vector<double> vm = Preproc(x, parsm);

      for (int io = 0; io < arch.back(); io++)
        ders.push_back(pow(nnl[io], 2) * ( vp[io] - vm[io] ) / 2 / eps / parsprep[ip]);
    }

  // Compare derivatives
  const std::vector<double> anders = nnp.Derive(x);
  const int nd = (int) anders.size();
  std::cout << std::scientific;
  std::cout << "id\t num. ders.\t an. ders.\t   ratio" << std::endl;
  for (int id = 0; id < nd; id++)
    std::cout << id << "\t" << ders[id] << "\t" << anders[id] << "\t" << ( anders[id] == 0 ? 0 : ders[id] / anders[id] ) << std::endl;
  std::cout << "\n";

  return 0;
}